

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong *puVar27;
  byte bVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ulong local_1200;
  size_t local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar45._4_4_ = fVar1;
  auVar45._0_4_ = fVar1;
  auVar45._8_4_ = fVar1;
  auVar45._12_4_ = fVar1;
  auVar45._16_4_ = fVar1;
  auVar45._20_4_ = fVar1;
  auVar45._24_4_ = fVar1;
  auVar45._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar46._4_4_ = fVar2;
  auVar46._0_4_ = fVar2;
  auVar46._8_4_ = fVar2;
  auVar46._12_4_ = fVar2;
  auVar46._16_4_ = fVar2;
  auVar46._20_4_ = fVar2;
  auVar46._24_4_ = fVar2;
  auVar46._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar47._4_4_ = fVar3;
  auVar47._0_4_ = fVar3;
  auVar47._8_4_ = fVar3;
  auVar47._12_4_ = fVar3;
  auVar47._16_4_ = fVar3;
  auVar47._20_4_ = fVar3;
  auVar47._24_4_ = fVar3;
  auVar47._28_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar48._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar48._8_4_ = -fVar1;
  auVar48._12_4_ = -fVar1;
  auVar48._16_4_ = -fVar1;
  auVar48._20_4_ = -fVar1;
  auVar48._24_4_ = -fVar1;
  auVar48._28_4_ = -fVar1;
  auVar49._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar49._8_4_ = -fVar2;
  auVar49._12_4_ = -fVar2;
  auVar49._16_4_ = -fVar2;
  auVar49._20_4_ = -fVar2;
  auVar49._24_4_ = -fVar2;
  auVar49._28_4_ = -fVar2;
  auVar50._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar50._8_4_ = -fVar3;
  auVar50._12_4_ = -fVar3;
  auVar50._16_4_ = -fVar3;
  auVar50._20_4_ = -fVar3;
  auVar50._24_4_ = -fVar3;
  auVar50._28_4_ = -fVar3;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar51._4_4_ = iVar4;
  auVar51._0_4_ = iVar4;
  auVar51._8_4_ = iVar4;
  auVar51._12_4_ = iVar4;
  auVar51._16_4_ = iVar4;
  auVar51._20_4_ = iVar4;
  auVar51._24_4_ = iVar4;
  auVar51._28_4_ = iVar4;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar52._4_4_ = iVar4;
  auVar52._0_4_ = iVar4;
  auVar52._8_4_ = iVar4;
  auVar52._12_4_ = iVar4;
  auVar52._16_4_ = iVar4;
  auVar52._20_4_ = iVar4;
  auVar52._24_4_ = iVar4;
  auVar52._28_4_ = iVar4;
  auVar53._8_4_ = 0x7fffffff;
  auVar53._0_8_ = 0x7fffffff7fffffff;
  auVar53._12_4_ = 0x7fffffff;
  auVar54._8_4_ = 0x80000000;
  auVar54._0_8_ = 0x8000000080000000;
  auVar54._12_4_ = 0x80000000;
  auVar55 = ZEXT816(0) << 0x40;
  puVar27 = local_11d0;
LAB_01d90b83:
  do {
    puVar21 = puVar27;
    if (puVar21 == &local_11d8) {
LAB_01d90ed9:
      return puVar21 != &local_11d8;
    }
    puVar27 = puVar21 + -1;
    uVar24 = puVar21[-1];
    while ((uVar24 & 8) == 0) {
      auVar42 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar19),auVar48,auVar45);
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar22),auVar49,auVar46);
      auVar9 = vpmaxsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar44));
      auVar42 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar23),auVar50,auVar47);
      auVar10 = vpmaxsd_avx2(ZEXT1632(auVar42),auVar51);
      auVar9 = vpmaxsd_avx2(auVar9,auVar10);
      auVar42 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar19 ^ 0x20)),auVar48,
                                auVar45);
      auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar22 ^ 0x20)),auVar49,
                                auVar46);
      auVar10 = vpminsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar44));
      auVar42 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar23 ^ 0x20)),auVar50,
                                auVar47);
      auVar11 = vpminsd_avx2(ZEXT1632(auVar42),auVar52);
      auVar10 = vpminsd_avx2(auVar10,auVar11);
      uVar26 = vpcmpd_avx512vl(auVar9,auVar10,2);
      if ((char)uVar26 == '\0') goto LAB_01d90b83;
      uVar17 = uVar24 & 0xfffffffffffffff0;
      lVar20 = 0;
      for (uVar24 = uVar26; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar24 = *(ulong *)(uVar17 + lVar20 * 8);
      uVar25 = (uint)uVar26 - 1 & (uint)uVar26;
      uVar26 = (ulong)uVar25;
      if (uVar25 != 0) {
        do {
          *puVar27 = uVar24;
          puVar27 = puVar27 + 1;
          lVar20 = 0;
          for (uVar24 = uVar26; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          uVar24 = *(ulong *)(uVar17 + lVar20 * 8);
        } while (uVar26 != 0);
      }
    }
    uVar26 = uVar24 & 0xfffffffffffffff0;
    for (lVar20 = 0; lVar20 != (ulong)((uint)uVar24 & 0xf) - 8; lVar20 = lVar20 + 1) {
      lVar18 = lVar20 * 0xb0;
      auVar42 = *(undefined1 (*) [16])(uVar26 + 0x80 + lVar18);
      auVar44 = *(undefined1 (*) [16])(uVar26 + 0x40 + lVar18);
      auVar43 = *(undefined1 (*) [16])(uVar26 + 0x70 + lVar18);
      auVar6 = *(undefined1 (*) [16])(uVar26 + 0x50 + lVar18);
      auVar30 = vmulps_avx512vl(auVar44,auVar42);
      auVar7 = *(undefined1 (*) [16])(uVar26 + 0x60 + lVar18);
      auVar8 = *(undefined1 (*) [16])(uVar26 + 0x30 + lVar18);
      auVar31 = vfmsub231ps_avx512vl(auVar30,auVar43,auVar6);
      auVar30 = vmulps_avx512vl(auVar6,auVar7);
      auVar32 = vfmsub231ps_avx512vl(auVar30,auVar42,auVar8);
      auVar33 = vmulps_avx512vl(auVar8,auVar43);
      auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
      auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
      auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      uVar5 = *(undefined4 *)(ray + k * 4);
      auVar30._4_4_ = uVar5;
      auVar30._0_4_ = uVar5;
      auVar30._8_4_ = uVar5;
      auVar30._12_4_ = uVar5;
      auVar30 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + lVar18),auVar30);
      auVar37 = vfmsub231ps_avx512vl(auVar33,auVar7,auVar44);
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar33._4_4_ = uVar5;
      auVar33._0_4_ = uVar5;
      auVar33._8_4_ = uVar5;
      auVar33._12_4_ = uVar5;
      auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x10 + lVar18),auVar33);
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar38._4_4_ = uVar5;
      auVar38._0_4_ = uVar5;
      auVar38._8_4_ = uVar5;
      auVar38._12_4_ = uVar5;
      auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + lVar18),auVar38);
      auVar39 = vmulps_avx512vl(auVar35,auVar38);
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar33,auVar36);
      auVar40 = vmulps_avx512vl(auVar36,auVar30);
      auVar40 = vfmsub231ps_avx512vl(auVar40,auVar38,auVar34);
      auVar41 = vmulps_avx512vl(auVar34,auVar33);
      auVar41 = vfmsub231ps_avx512vl(auVar41,auVar30,auVar35);
      auVar36 = vmulps_avx512vl(auVar37,auVar36);
      auVar35 = vfmadd231ps_avx512vl(auVar36,auVar32,auVar35);
      auVar34 = vfmadd231ps_avx512vl(auVar35,auVar31,auVar34);
      auVar35 = vandps_avx512vl(auVar34,auVar53);
      auVar36 = vandps_avx512vl(auVar34,auVar54);
      auVar42 = vmulps_avx512vl(auVar42,auVar41);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar40,auVar43);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar39,auVar7);
      auVar42 = vxorps_avx512vl(auVar36,auVar42);
      auVar43 = vmulps_avx512vl(auVar6,auVar41);
      auVar44 = vfmadd231ps_avx512vl(auVar43,auVar44,auVar40);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar8,auVar39);
      auVar44 = vxorps_avx512vl(auVar36,auVar44);
      uVar12 = vcmpps_avx512vl(auVar42,auVar55,5);
      uVar13 = vcmpps_avx512vl(auVar44,auVar55,5);
      uVar14 = vcmpps_avx512vl(auVar34,auVar55,4);
      auVar42 = vaddps_avx512vl(auVar42,auVar44);
      uVar15 = vcmpps_avx512vl(auVar42,auVar35,2);
      bVar28 = (byte)uVar12 & (byte)uVar13 & (byte)uVar14 & (byte)uVar15;
      if (bVar28 != 0) {
        auVar42 = vmulps_avx512vl(auVar37,auVar38);
        auVar42 = vfmadd213ps_fma(auVar33,auVar32,auVar42);
        auVar42 = vfmadd213ps_fma(auVar30,auVar31,auVar42);
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar44._4_4_ = uVar5;
        auVar44._0_4_ = uVar5;
        auVar44._8_4_ = uVar5;
        auVar44._12_4_ = uVar5;
        auVar44 = vmulps_avx512vl(auVar35,auVar44);
        auVar43 = vxorps_avx512vl(auVar36,auVar42);
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar42._4_4_ = uVar5;
        auVar42._0_4_ = uVar5;
        auVar42._8_4_ = uVar5;
        auVar42._12_4_ = uVar5;
        auVar42 = vmulps_avx512vl(auVar35,auVar42);
        uVar12 = vcmpps_avx512vl(auVar43,auVar42,2);
        uVar13 = vcmpps_avx512vl(auVar44,auVar43,1);
        bVar29 = (byte)uVar12 & (byte)uVar13;
        if ((bVar29 & bVar28) != 0) {
          local_1200 = (ulong)(bVar29 & bVar28);
          do {
            uVar17 = 0;
            for (uVar16 = local_1200; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000)
            {
              uVar17 = uVar17 + 1;
            }
            if ((((context->scene->geometries).items[*(uint *)(lVar18 + uVar26 + 0x90 + uVar17 * 4)]
                 .ptr)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_01d90ed9;
            }
            local_1200 = local_1200 ^ 1L << (uVar17 & 0x3f);
          } while (local_1200 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }